

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O2

idx_t __thiscall
duckdb::StringSplitter::Split<duckdb::RegularStringSplit>
          (StringSplitter *this,string_t input,string_t delim,StringSplitInput *state,void *data)

{
  idx_t split_size;
  char *needle;
  idx_t match_size;
  ulong needle_size;
  ulong haystack_size;
  idx_t list_idx;
  char *haystack;
  long lVar1;
  string_t delim_local;
  string_t input_local;
  
  delim_local.value.pointer.ptr = (char *)delim.value._0_8_;
  delim_local.value._0_8_ = input.value._8_8_;
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  haystack = input_local.value.pointer.ptr;
  if ((uint)this < 0xd) {
    haystack = input_local.value.pointer.prefix;
  }
  needle = delim_local.value.pointer.ptr;
  if (input.value._8_4_ < 0xd) {
    needle = delim_local.value.pointer.prefix;
  }
  needle_size = delim_local.value._0_8_ & 0xffffffff;
  list_idx = 0;
  input_local.value._0_8_ = this;
  for (haystack_size = (ulong)this & 0xffffffff; haystack_size != 0;
      haystack_size = haystack_size - lVar1) {
    if (input.value._8_4_ == 0) {
      split_size = 0;
    }
    else {
      split_size = FindStrInStr((uchar *)haystack,haystack_size,(uchar *)needle,needle_size);
      if (haystack_size < split_size) break;
    }
    if ((split_size == 0 &&
         ((undefined1  [16])input.value & (undefined1  [16])0xffffffff) == (undefined1  [16])0x0) &&
       ((split_size = 1, haystack_size == 1 || (haystack_size == 1)))) break;
    StringSplitInput::AddSplit(delim.value._8_8_,haystack,split_size,list_idx);
    list_idx = list_idx + 1;
    lVar1 = split_size + needle_size;
    haystack = haystack + lVar1;
  }
  StringSplitInput::AddSplit(delim.value._8_8_,haystack,haystack_size,list_idx);
  return list_idx + 1;
}

Assistant:

static idx_t Split(string_t input, string_t delim, StringSplitInput &state, void *data) {
		auto input_data = input.GetData();
		auto input_size = input.GetSize();
		auto delim_data = delim.GetData();
		auto delim_size = delim.GetSize();
		idx_t list_idx = 0;
		while (input_size > 0) {
			idx_t match_size = 0;
			auto pos = OP::Find(input_data, input_size, delim_data, delim_size, match_size, data);
			if (pos > input_size) {
				break;
			}
			if (match_size == 0 && pos == 0) {
				// special case: 0 length match and pos is 0
				// move to the next character
				for (pos++; pos < input_size; pos++) {
					if (IsCharacter(input_data[pos])) {
						break;
					}
				}
				if (pos == input_size) {
					break;
				}
			}
			D_ASSERT(input_size >= pos + match_size);
			state.AddSplit(input_data, pos, list_idx);

			list_idx++;
			input_data += (pos + match_size);
			input_size -= (pos + match_size);
		}
		state.AddSplit(input_data, input_size, list_idx);
		list_idx++;
		return list_idx;
	}